

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O0

void llbuild::commands::util::emitError
               (StringRef filename,StringRef message,Token *at,Parser *parser)

{
  uint length;
  uint line;
  uint column;
  char *position;
  Lexer *this;
  StringRef buffer;
  Parser *parser_local;
  Token *at_local;
  StringRef message_local;
  StringRef filename_local;
  
  position = at->start;
  length = at->length;
  line = at->line;
  column = at->column;
  this = ninja::Parser::getLexer(parser);
  buffer = ninja::Lexer::getBuffer(this);
  ::emitError(filename,message,position,length,line,column,buffer);
  return;
}

Assistant:

void util::emitError(StringRef filename, StringRef message,
                     const ninja::Token& at, const ninja::Parser* parser) {
  ::emitError(filename, message, at.start, at.length, at.line, at.column,
            parser->getLexer().getBuffer());
}